

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O0

void __thiscall
QAbstractFileEngineIterator::QAbstractFileEngineIterator
          (QAbstractFileEngineIterator *this,QString *path,Filters filters,QStringList *nameFilters)

{
  long lVar1;
  undefined4 in_EDX;
  QFileInfo *in_RDI;
  long in_FS_OFFSET;
  QList<QString> *in_stack_ffffffffffffffa8;
  QList<QString> *this_00;
  QString *path_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d_ptr).d.ptr = (QFileInfoPrivate *)&PTR__QAbstractFileEngineIterator_00be2660;
  this_00 = (QList<QString> *)(in_RDI + 1);
  QFileInfo::QFileInfo(in_RDI);
  *(undefined4 *)&in_RDI[2].d_ptr.d.ptr = in_EDX;
  QFlags<QDirListing::IteratorFlag>::QFlags((QFlags<QDirListing::IteratorFlag> *)0x26e5f4);
  path_00 = (QString *)(in_RDI + 3);
  QList<QString>::QList(this_00,in_stack_ffffffffffffffa8);
  appendSlashIfNeeded(path_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractFileEngineIterator::QAbstractFileEngineIterator(const QString &path, QDir::Filters filters,
                                                         const QStringList &nameFilters)
    : m_filters(filters),
      m_nameFilters(nameFilters),
      m_path(appendSlashIfNeeded(path))
{
}